

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.hpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerMSL::get_is_rasterization_disabled(CompilerMSL *this)

{
  SPIREntryPoint *pSVar1;
  bool local_21;
  bool local_11;
  CompilerMSL *this_local;
  
  local_11 = false;
  if ((this->is_rasterization_disabled & 1U) != 0) {
    pSVar1 = Compiler::get_entry_point((Compiler *)this);
    local_21 = true;
    if (pSVar1->model != ExecutionModelVertex) {
      pSVar1 = Compiler::get_entry_point((Compiler *)this);
      local_21 = true;
      if (pSVar1->model != ExecutionModelTessellationControl) {
        pSVar1 = Compiler::get_entry_point((Compiler *)this);
        local_21 = pSVar1->model == ExecutionModelTessellationEvaluation;
      }
    }
    local_11 = local_21;
  }
  return local_11;
}

Assistant:

bool get_is_rasterization_disabled() const
	{
		return is_rasterization_disabled && (get_entry_point().model == spv::ExecutionModelVertex ||
		                                     get_entry_point().model == spv::ExecutionModelTessellationControl ||
		                                     get_entry_point().model == spv::ExecutionModelTessellationEvaluation);
	}